

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_code_zstd(archive *a,la_zstream *lastrm,la_zaction action)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  ZSTD_EndDirective mode;
  size_t zret;
  ZSTD_inBuffer in;
  ZSTD_outBuffer out;
  ZSTD_CStream *strm;
  la_zaction action_local;
  la_zstream *lastrm_local;
  archive *a_local;
  
  in.pos = (size_t)lastrm->next_out;
  zret = (size_t)lastrm->next_in;
  in.src = (void *)lastrm->avail_in;
  in.size = 0;
  uVar1 = 2;
  if (action == ARCHIVE_Z_RUN) {
    uVar1 = 0;
  }
  lVar3 = ZSTD_compressStream2(lastrm->real_stream,&in.pos,&zret,uVar1);
  iVar2 = ZSTD_isError(lVar3);
  if (iVar2 == 0) {
    lastrm->next_in = lastrm->next_in + in.size;
    lastrm->avail_in = lastrm->avail_in - in.size;
    lastrm->total_in = in.size + lastrm->total_in;
    lastrm->next_out = lastrm->next_out;
    lastrm->avail_out = lastrm->avail_out;
    lastrm->total_out = lastrm->total_out;
    if ((action == ARCHIVE_Z_FINISH) && (lVar3 == 0)) {
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    uVar4 = ZSTD_getErrorName(lVar3);
    archive_set_error(a,-1,"zstd compression failed, ZSTD_compressStream2 returned: %s",uVar4);
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_code_zstd(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	ZSTD_CStream *strm = (ZSTD_CStream *)lastrm->real_stream;

	ZSTD_outBuffer out = { .dst = lastrm->next_out, .size = lastrm->avail_out, .pos = 0 };
	ZSTD_inBuffer  in  = { .src = lastrm->next_in,  .size = lastrm->avail_in,  .pos = 0 };

	size_t zret;

	ZSTD_EndDirective mode = (action == ARCHIVE_Z_RUN) ? ZSTD_e_continue : ZSTD_e_end;

	zret = ZSTD_compressStream2(strm, &out, &in, mode);
	if (ZSTD_isError(zret)) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
			"zstd compression failed, ZSTD_compressStream2 returned: %s",
			ZSTD_getErrorName(zret));
		return (ARCHIVE_FATAL);
	}

	lastrm->next_in += in.pos;
	lastrm->avail_in -= in.pos;
	lastrm->total_in += in.pos;

	lastrm->next_out += out.pos;
	lastrm->avail_out -= out.pos;
	lastrm->total_out += out.pos;

	if (action == ARCHIVE_Z_FINISH && zret == 0)
		return (ARCHIVE_EOF); // All done.

	return (ARCHIVE_OK); // More work to do.
}